

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint waitForDsrEQ(uchar mask,uchar bitVal,ulong ms)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  longlong timer_00;
  bool foundF;
  longlong timer;
  uchar readVal;
  uchar testVal;
  ulong ms_local;
  uchar bitVal_local;
  uchar mask_local;
  
  bVar1 = false;
  timer_00 = tmrReadTimer();
  do {
    bVar2 = inb((unsigned_short)ZvgIO.ecpDsr);
    if ((bVar2 & mask) == ((bitVal ^ 0x80) & mask)) {
      bVar1 = true;
      break;
    }
    iVar3 = tmrTestMillis(timer_00,(int)ms);
  } while (iVar3 == 0);
  if (bVar1) {
    ms_local._4_4_ = bVar2 ^ 0x80;
  }
  else {
    ms_local._4_4_ = 0xffffffff;
  }
  return ms_local._4_4_;
}

Assistant:

static uint waitForDsrEQ( uchar mask, uchar bitVal, ulong ms)
{
	uchar		testVal;
	uchar		readVal;
	long long int	timer;
	bool		foundF;

	testVal = (bitVal ^ DSR_InvMask) & mask;
	foundF = zFalse;
	//tmrReadTimer(&timer);					// read timer value
	timer = tmrReadTimer();
	// loop until match found, or timeout

	do
	{
		if (((readVal = inportb( ZvgIO.ecpDsr)) & mask) == testVal)
		{	foundF = zTrue;				// indicate match was found
			break;
		}
	} while (!tmrTestMillis( timer, ms));

	if (!foundF)				
		return (ZVG_TIMEOUT);			// match not found, return error

	return (readVal ^ DSR_InvMask);	// fix logic and return value
}